

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

bool __thiscall ExecutorX86::Run(ExecutorX86 *this,uint functionID,char *arguments)

{
  uint uVar1;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar2;
  RegVmRegister *pRVar3;
  uchar *puVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ExternFuncInfo *pEVar9;
  uchar **ppuVar10;
  size_t sVar11;
  ExternTypeInfo *pEVar12;
  ExternMemberInfo *pEVar13;
  ExternTypeInfo *targetType;
  ExternFuncInfo *target_1;
  uint address;
  uint currentFrame;
  char *currPos;
  nullcFunc gate;
  jmp_buf prevErrorHandler;
  uchar *codeStart;
  JmpBufData data;
  int errorCode;
  sigaction sigSEGV;
  sigaction sigTRAP;
  sigaction sigFPE;
  sigaction sa;
  RegVmReturnType resultType;
  RegVmRegister *prevRegFilePtr;
  CodeGenRegVmCallStackEntry *entry_1;
  uint stackSize;
  CodeGenRegVmCallStackEntry *entry;
  uint argumentsSize;
  uint funcPos;
  ExternFuncInfo *target;
  RegVmRegister *regFilePtr;
  uint prevDataSize;
  uint prevLastFinalReturn;
  uint uStack_30;
  bool errorState;
  uint instructionPos;
  RegVmReturnType retType;
  bool firstRun;
  char *arguments_local;
  uint functionID_local;
  ExecutorX86 *this_local;
  
  bVar5 = FastVector<RegVmCmd,_false,_false>::empty(this->exRegVmCode);
  if (bVar5) {
    Stop(this,"ERROR: module contains no code");
    this_local._7_1_ = false;
  }
  else {
    bVar5 = (this->codeRunning & 1U) == 0;
    if ((!bVar5 && functionID != 0xffffffff) || (bVar6 = InitExecution(this), bVar6)) {
      this->codeRunning = true;
      uStack_30 = 0;
      prevLastFinalReturn = 0;
      bVar6 = false;
      uVar1 = this->lastFinalReturn;
      this->lastFinalReturn =
           (uint)((long)(this->vmState).callStackTop - (long)(this->vmState).callStackBase >> 2);
      uVar7 = (int)(this->vmState).dataStackTop - (int)(this->vmState).dataStackBase;
      if ((uVar7 & 0xf) != 0) {
        __assert_fail("prevDataSize % 16 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                      ,0x35d,"bool ExecutorX86::Run(unsigned int, const char *)");
      }
      paVar2 = &((this->vmState).regFileLastTop)->field_0;
      if (functionID == 0xffffffff) {
        if ((uint)((int)(this->vmState).dataStackTop - (int)(this->vmState).dataStackBase) <
            this->exLinker->globalVarSize) {
          __assert_fail("unsigned(vmState.dataStackTop - vmState.dataStackBase) >= exLinker->globalVarSize"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                        ,0x3c1,"bool ExecutorX86::Run(unsigned int, const char *)");
        }
        NULLC::fillMemory((this->vmState).dataStackBase,0,(ulong)this->exLinker->globalVarSize);
        *paVar2 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
        paVar2[1] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
        paVar2[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)
                    (this->exLinker->exRegVmConstants).data;
        paVar2[3].longValue = (int64_t)paVar2;
        NULLC::fillMemory(paVar2 + 4,0,0x7e0);
      }
      else {
        pEVar9 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionID);
        prevLastFinalReturn = pEVar9->regVmAddress;
        uStack_30 = GetFunctionVmReturnType
                              (pEVar9,this->exTypes->data,(this->exLinker->exTypeExtra).data);
        if (prevLastFinalReturn == 0xffffffff) {
          if (pEVar9->retType == '\0') {
            Stop(this,"ERROR: can\'t call external function with complex return type");
            return false;
          }
          NULLC::copyMemory((this->vmState).tempStackArrayBase,arguments,(ulong)pEVar9->argumentSize
                           );
          if (pEVar9->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
            Stop(this,"ERROR: external raw function calls are disabled");
            bVar6 = true;
          }
          else {
            (*pEVar9->funcPtrWrap)
                      (pEVar9->funcPtrWrapTarget,(char *)(this->vmState).tempStackArrayBase,
                       (char *)(this->vmState).tempStackArrayBase);
            bVar6 = (this->callContinue & 1U) == 0;
          }
          prevLastFinalReturn = 0xffffffff;
        }
        else if (((int)(this->vmState).dataStackTop - (int)(this->vmState).dataStackBase) +
                 pEVar9->argumentSize <
                 (uint)((int)(this->vmState).dataStackEnd - (int)(this->vmState).dataStackBase)) {
          NULLC::copyMemory((this->vmState).dataStackTop,arguments,(ulong)pEVar9->argumentSize);
          if (((int)(this->vmState).dataStackTop - (int)(this->vmState).dataStackBase) +
              (pEVar9->stackSize + 0xf & 0xfffffff0) <
              (uint)((int)(this->vmState).dataStackEnd - (int)(this->vmState).dataStackBase)) {
            *paVar2 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
            paVar2[1].longValue = (int64_t)((this->vmState).dataStackBase + uVar7);
            paVar2[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)
                        (this->exLinker->exRegVmConstants).data;
            paVar2[3].longValue = (int64_t)paVar2;
          }
          else {
            ((this->vmState).callStackTop)->instruction = prevLastFinalReturn + 1;
            (this->vmState).callStackTop = (this->vmState).callStackTop + 1;
            prevLastFinalReturn = 0xffffffff;
            Stop(this,"ERROR: stack overflow");
            uStack_30 = 5;
          }
        }
        else {
          ((this->vmState).callStackTop)->instruction = prevLastFinalReturn + 1;
          (this->vmState).callStackTop = (this->vmState).callStackTop + 1;
          prevLastFinalReturn = 0xffffffff;
          Stop(this,"ERROR: stack overflow");
          uStack_30 = 5;
        }
      }
      pRVar3 = (this->vmState).regFileLastPtr;
      (this->vmState).regFileLastPtr = (RegVmRegister *)paVar2;
      if (functionID == 0xffffffff) {
        (this->vmState).regFileLastTop = (this->vmState).regFileLastTop + 0x100;
      }
      sa.sa_restorer._4_4_ = uStack_30;
      if (prevLastFinalReturn != 0xffffffff) {
        (this->vmState).jitCodeActive = true;
        if (bVar5 || functionID == 0xffffffff) {
          sigFPE.sa_restorer = NULLC::HandleError;
          sigemptyset((sigset_t *)&sa);
          sa.sa_mask.__val[0xf]._0_4_ = 0x10000004;
          sigaction(8,(sigaction *)&sigFPE.sa_restorer,(sigaction *)&sigTRAP.sa_restorer);
          sigaction(5,(sigaction *)&sigFPE.sa_restorer,(sigaction *)&sigSEGV.sa_restorer);
          sigaction(0xb,(sigaction *)&sigFPE.sa_restorer,(sigaction *)(data.data + 0xc4));
        }
        data.data[0xc0] = '\0';
        data.data[0xc1] = '\0';
        data.data[0xc2] = '\0';
        data.data[0xc3] = '\0';
        NULLC::copyMemory((void *)((long)&codeStart + 4),NULLC::errorHandler,200);
        data.data._192_4_ = __sigsetjmp(NULLC::errorHandler,1);
        if (data.data._192_4_ == 0) {
          ppuVar10 = FastVector<unsigned_char_*,_false,_false>::operator[]
                               (&this->instAddress,prevLastFinalReturn);
          puVar4 = *ppuVar10;
          NULLC::copyMemory(&gate,&this->vmState,200);
          iVar8 = _setjmp((__jmp_buf_tag *)&this->vmState);
          if (iVar8 == 0) {
            sa.sa_restorer._4_4_ = (*(code *)this->codeLaunchHeader)(puVar4,paVar2);
          }
          else {
            sa.sa_restorer._4_4_ = 5;
          }
          NULLC::copyMemory(&this->vmState,&gate,200);
        }
        else {
          sa.sa_restorer._4_4_ = 5;
        }
        if (this->lastFinalReturn == 0) {
          sigaction(8,(sigaction *)&sigTRAP.sa_restorer,(sigaction *)0x0);
          sigaction(5,(sigaction *)&sigSEGV.sa_restorer,(sigaction *)0x0);
          sigaction(0xb,(sigaction *)(data.data + 0xc4),(sigaction *)0x0);
        }
        NULLC::copyMemory(NULLC::errorHandler,(void *)((long)&codeStart + 4),200);
        (this->vmState).jitCodeActive = false;
      }
      (this->vmState).regFileLastPtr = pRVar3;
      if (functionID == 0xffffffff) {
        (this->vmState).regFileLastTop = (this->vmState).regFileLastTop + -0x100;
      }
      (this->vmState).dataStackTop = (this->vmState).dataStackBase + uVar7;
      if (sa.sa_restorer._4_4_ == 5) {
        bVar6 = true;
      }
      else if (uStack_30 == 0) {
        uStack_30 = sa.sa_restorer._4_4_;
      }
      else if (uStack_30 != sa.sa_restorer._4_4_) {
        __assert_fail("retType == resultType && \"expected different result\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                      ,0x43f,"bool ExecutorX86::Run(unsigned int, const char *)");
      }
      if (bVar6) {
        if (this->lastFinalReturn == 0) {
          _address = this->execErrorBuffer;
          sVar11 = strlen(this->execErrorBuffer);
          _address = _address + sVar11;
          iVar8 = NULLC::SafeSprintf(_address,(long)(0x10000 -
                                                    ((int)_address - (int)this->execErrorBuffer)),
                                     "\r\nCall stack:\r\n");
          _address = _address + iVar8;
          target_1._4_4_ = 0;
          while( true ) {
            uVar7 = GetCallStackAddress(this,target_1._4_4_);
            if (uVar7 == 0) break;
            uVar7 = PrintStackFrame(uVar7,_address,
                                    0x10000 - ((int)_address - (int)this->execErrorBuffer),false);
            _address = _address + uVar7;
            target_1._4_4_ = target_1._4_4_ + 1;
          }
        }
        this->execErrorFinalReturnDepth = this->lastFinalReturn;
        this->lastFinalReturn = uVar1;
        this->callContinue = false;
        this->codeRunning = false;
        this_local._7_1_ = false;
      }
      else {
        if (this->lastFinalReturn == 0) {
          this->codeRunning = false;
        }
        this->lastFinalReturn = uVar1;
        if (functionID == 0xffffffff) {
          (this->vmState).tempStackType = 0;
          if (uStack_30 == 1) {
            (this->vmState).tempStackType = 7;
          }
          else if (uStack_30 == 2) {
            (this->vmState).tempStackType = 5;
          }
          else if (uStack_30 == 3) {
            (this->vmState).tempStackType = 4;
          }
        }
        else {
          pEVar9 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                             (this->exFunctions,functionID);
          pEVar12 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                              (this->exTypes,pEVar9->funcType);
          pEVar13 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                              (&this->exLinker->exTypeExtra,(pEVar12->field_11).subType);
          (this->vmState).tempStackType = pEVar13->type;
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorX86::Run(unsigned int functionID, const char *arguments)
{
	if(exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	bool firstRun = !codeRunning || functionID == ~0u;

	if(firstRun)
	{
		if(!InitExecution())
			return false;
	}

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	unsigned instructionPos = 0;

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = unsigned(vmState.callStackTop - vmState.callStackBase);

	unsigned prevDataSize = unsigned(vmState.dataStackTop - vmState.dataStackBase);

	assert(prevDataSize % 16 == 0);

	RegVmRegister *regFilePtr = vmState.regFileLastTop;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Can't return complex types here
			if(target.retType == ExternFuncInfo::RETURN_UNKNOWN)
			{
				Stop("ERROR: can't call external function with complex return type");
				return false;
			}

			// Copy all arguments
			NULLC::copyMemory(vmState.tempStackArrayBase, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)vmState.tempStackArrayBase, (char*)vmState.tempStackArrayBase);

				if(!callContinue)
					errorState = true;
			}
			else
			{
#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
				RunRawExternalFunction(dcCallVM, exFunctions[functionID], exLinker->exLocals.data, exTypes.data, exLinker->exTypeExtra.data, vmState.tempStackArrayBase, vmState.tempStackArrayBase);

				if(!callContinue)
					errorState = true;
#else
				Stop("ERROR: external raw function calls are disabled");

				errorState = true;
#endif
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instructionPos = ~0u;
		}
		else
		{
			instructionPos = funcPos;

			unsigned argumentsSize = target.argumentSize;

			if(unsigned(vmState.dataStackTop - vmState.dataStackBase) + argumentsSize >= unsigned(vmState.dataStackEnd - vmState.dataStackBase))
			{
				CodeGenRegVmCallStackEntry *entry = vmState.callStackTop;

				entry->instruction = instructionPos + 1;

				vmState.callStackTop++;

				instructionPos = ~0u;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				NULLC::copyMemory(vmState.dataStackTop, arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				if(unsigned(vmState.dataStackTop - vmState.dataStackBase) + stackSize >= unsigned(vmState.dataStackEnd - vmState.dataStackBase))
				{
					CodeGenRegVmCallStackEntry *entry = vmState.callStackTop;

					entry->instruction = instructionPos + 1;

					vmState.callStackTop++;

					instructionPos = ~0u;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(vmState.dataStackBase);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(vmState.dataStackBase + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(unsigned(vmState.dataStackTop - vmState.dataStackBase) >= exLinker->globalVarSize);
		NULLC::fillMemory(vmState.dataStackBase, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(vmState.dataStackBase);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(vmState.dataStackBase);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		NULLC::fillMemory(regFilePtr + rvrrCount, 0, (256 - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFilePtr = vmState.regFileLastPtr;

	vmState.regFileLastPtr = regFilePtr;

	if(functionID == ~0u)
		vmState.regFileLastTop += 256;

	RegVmReturnType resultType = retType;

	if(instructionPos != ~0u)
	{
		vmState.jitCodeActive = true;

#ifdef __linux
		struct sigaction sa;
		struct sigaction sigFPE;
		struct sigaction sigTRAP;
		struct sigaction sigSEGV;

		if(firstRun)
		{
			sa.sa_sigaction = NULLC::HandleError;
			sigemptyset(&sa.sa_mask);
			sa.sa_flags = SA_RESTART | SA_SIGINFO;

			sigaction(SIGFPE, &sa, &sigFPE);
			sigaction(SIGTRAP, &sa, &sigTRAP);
			sigaction(SIGSEGV, &sa, &sigSEGV);
		}

		int errorCode = 0;

		NULLC::JmpBufData data;
		NULLC::copyMemory(data.data, NULLC::errorHandler, sizeof(sigjmp_buf));

		if(!(errorCode = sigsetjmp(NULLC::errorHandler, 1)))
		{
			unsigned char *codeStart = instAddress[instructionPos];

			jmp_buf prevErrorHandler;
			NULLC::copyMemory(&prevErrorHandler, &vmState.errorHandler, sizeof(jmp_buf));

			if(!setjmp(vmState.errorHandler))
			{
				typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
				nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
				resultType = (RegVmReturnType)gate(codeStart, regFilePtr);
			}
			else
			{
				resultType = rvrError;
			}

			NULLC::copyMemory(&vmState.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		}
		else
		{
			resultType = rvrError;
		}

		// Disable signal handlers only from top-level Run
		if(lastFinalReturn == 0)
		{
			sigaction(SIGFPE, &sigFPE, NULL);
			sigaction(SIGTRAP, &sigTRAP, NULL);
			sigaction(SIGSEGV, &sigSEGV, NULL);
		}

		NULLC::copyMemory(NULLC::errorHandler, data.data, sizeof(sigjmp_buf));
#else
		__try
		{
			unsigned char *codeStart = instAddress[instructionPos];

			jmp_buf prevErrorHandler;
			NULLC::copyMemory(&prevErrorHandler, &vmState.errorHandler, sizeof(jmp_buf));

			if(!setjmp(vmState.errorHandler))
			{
				typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
				nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
				resultType = (RegVmReturnType)gate(codeStart, regFilePtr);
			}
			else
			{
				resultType = rvrError;
			}

			NULLC::copyMemory(&vmState.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		}
		__except(NULLC::CanWeHandleSEH(GetExceptionCode(), GetExceptionInformation()))
		{
			resultType = rvrError;
		}
#endif

		vmState.jitCodeActive = false;
	}

	vmState.regFileLastPtr = prevRegFilePtr;

	if(functionID == ~0u)
		vmState.regFileLastTop -= 256;

	vmState.dataStackTop = vmState.dataStackBase + prevDataSize;

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	if(lastFinalReturn == 0)
		codeRunning = false;

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		vmState.tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		vmState.tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			vmState.tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			vmState.tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			vmState.tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}